

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall tcu::TextureCube::TextureCube(TextureCube *this,TextureFormat *format,int size)

{
  uint uVar1;
  int face;
  long lVar2;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *this_00;
  ConstPixelBufferAccess *levels [6];
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58 [7];
  
  this->m_format = *format;
  this->m_size = size;
  (this->m_view).m_levels[0] = (ConstPixelBufferAccess *)0x0;
  (this->m_view).m_levels[1] = (ConstPixelBufferAccess *)0x0;
  (this->m_view).m_levels[2] = (ConstPixelBufferAccess *)0x0;
  (this->m_view).m_levels[3] = (ConstPixelBufferAccess *)0x0;
  (this->m_view).m_levels[4] = (ConstPixelBufferAccess *)0x0;
  (this->m_view).m_levels[5] = (ConstPixelBufferAccess *)0x0;
  uVar1 = 0x20;
  if (size != 0) {
    uVar1 = 0x1f;
    if (size != 0) {
      for (; (uint)size >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar1 = uVar1 ^ 0x1f;
  }
  this_00 = this->m_access;
  uVar1 = 0x20 - uVar1;
  lVar2 = 0;
  memset(this->m_data,0,0x124);
  do {
    std::
    vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ::resize((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
              *)(this_00 + -6),(ulong)uVar1);
    std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
              (this_00,(ulong)uVar1);
    local_58[lVar2] =
         (this_00->
         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>).
         _M_impl.super__Vector_impl_data._M_start;
    lVar2 = lVar2 + 1;
    this_00 = this_00 + 1;
  } while (lVar2 != 6);
  local_68 = (undefined4)local_58[4];
  uStack_64 = (undefined4)((ulong)local_58[4] >> 0x20);
  uStack_60 = (undefined4)local_58[5];
  uStack_5c = (undefined4)((ulong)local_58[5] >> 0x20);
  local_78 = (undefined4)local_58[2];
  uStack_74 = (undefined4)((ulong)local_58[2] >> 0x20);
  uStack_70 = (undefined4)local_58[3];
  uStack_6c = (undefined4)((ulong)local_58[3] >> 0x20);
  local_88 = (undefined4)local_58[0];
  uStack_84 = (undefined4)((ulong)local_58[0] >> 0x20);
  uStack_80 = (undefined4)local_58[1];
  uStack_7c = (undefined4)((ulong)local_58[1] >> 0x20);
  (this->m_view).m_numLevels = uVar1;
  *(ulong *)&(this->m_view).field_0x4 = CONCAT44(local_88,uStack_8c);
  *(ulong *)((long)(this->m_view).m_levels + 4) = CONCAT44(uStack_80,uStack_84);
  *(ulong *)((long)(this->m_view).m_levels + 0xc) = CONCAT44(local_78,uStack_7c);
  *(ulong *)((long)(this->m_view).m_levels + 0x14) = CONCAT44(uStack_70,uStack_74);
  *(ulong *)((long)(this->m_view).m_levels + 0x1c) = CONCAT44(local_68,uStack_6c);
  *(ulong *)((long)(this->m_view).m_levels + 0x24) = CONCAT44(uStack_60,uStack_64);
  *(undefined4 *)((long)(this->m_view).m_levels + 0x2c) = uStack_5c;
  return;
}

Assistant:

TextureCube::TextureCube (const TextureFormat& format, int size)
	: m_format	(format)
	, m_size	(size)
{
	const int						numLevels		= computeMipPyramidLevels(m_size);
	const ConstPixelBufferAccess*	levels[CUBEFACE_LAST];

	for (int face = 0; face < CUBEFACE_LAST; face++)
	{
		m_data[face].resize(numLevels);
		m_access[face].resize(numLevels);
		levels[face] = &m_access[face][0];
	}

	m_view = TextureCubeView(numLevels, levels);
}